

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

char * CVmBif::pop_str_val_ui(char *buf,size_t buflen)

{
  char *pcVar1;
  size_t sVar2;
  size_t in_RSI;
  CCharmapToLocal *in_RDI;
  size_t unaff_retaddr;
  size_t copy_len;
  char *strp;
  
  pcVar1 = pop_str_val();
  sVar2 = vmb_get_len((char *)0x2f4b22);
  if (in_RSI == 0) {
    sVar2 = CCharmapToLocal::map_utf8_alo(in_RDI,(char **)0x0,pcVar1 + 2,sVar2);
  }
  else {
    sVar2 = CCharmapToLocal::map_utf8
                      ((CCharmapToLocal *)strp,(char *)copy_len,unaff_retaddr,(char *)in_RDI,in_RSI,
                       (size_t *)(pcVar1 + 2));
  }
  *(undefined1 *)((long)in_RDI->map_ + (sVar2 - 0x10)) = 0;
  return (char *)in_RDI;
}

Assistant:

char *CVmBif::pop_str_val_ui(VMG_ char *buf, size_t buflen)
{
    /* pop the string value */
    const char *strp = pop_str_val(vmg0_);

    /* decode and skip the length prefix */
    size_t copy_len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* 
     *   if they didn't allocate any space for the buffer, allocate one on
     *   the caller's behalf; otherwise map the string into the caller's
     *   buffer
     */
    if (buflen == 0)
    {
        /* the caller didn't provide a buffer, so allocate one */
        copy_len = G_cmap_to_ui->map_utf8_alo(&buf, strp, copy_len);
    }
    else
    {
        /* the caller provided a buffer, so use it for the mapping result */
        copy_len = G_cmap_to_ui->map_utf8(buf, buflen - 1, strp, copy_len, 0);
    }

    /* null-terminate the result */
    buf[copy_len] = '\0';

    /* return the buffer */
    return buf;
}